

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  Pair *pPVar1;
  ulong uVar2;
  Pair *pPVar3;
  ulong uVar4;
  ulong uVar5;
  
  pPVar1 = (this->Data).Data;
  uVar4 = (ulong)(this->Data).Size;
  pPVar3 = pPVar1;
  uVar5 = uVar4;
  while (uVar2 = uVar5, uVar2 != 0) {
    uVar5 = uVar2 >> 1;
    if (pPVar3[uVar5].key < key) {
      pPVar3 = pPVar3 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  if ((pPVar3 != pPVar1 + uVar4) && (pPVar3->key == key)) {
    default_val = (pPVar3->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImVector<Pair>::iterator it = LowerBound(const_cast<ImVector<ImGuiStorage::Pair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}